

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O3

int Abc_NtkAppend(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fAddPos)

{
  long *plVar1;
  long lVar2;
  Nm_Man_t *p;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Obj_t *pFaninOld;
  long lVar10;
  ulong uVar11;
  
  if (pNtk1->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x146,"int Abc_NtkAppend(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if (pNtk2->ntkType == ABC_NTK_LOGIC) {
    iVar4 = Abc_NtkToAig(pNtk2);
    if (iVar4 == 0) {
      pcVar8 = "Converting to AIGs has failed.";
      goto LAB_003092fd;
    }
  }
  else if (pNtk2->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsLogic(pNtk2) || Abc_NtkIsStrash(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x147,"int Abc_NtkAppend(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar4 = Abc_NtkCompareSignals(pNtk1,pNtk2,1,1);
  if (iVar4 == 0) {
    puts("Abc_NtkAppend(): The union of the network PIs is computed (warning).");
  }
  Abc_NtkCleanCopy(pNtk2);
  if (pNtk2->ntkType == ABC_NTK_STRASH) {
    pAVar6 = Abc_AigConst1(pNtk1);
    pAVar7 = Abc_AigConst1(pNtk2);
    (pAVar7->field_6).pCopy = pAVar6;
  }
  pVVar9 = pNtk2->vCis;
  if (0 < pVVar9->nSize) {
    lVar10 = 0;
    uVar11 = 0;
    do {
      pAVar6 = (Abc_Obj_t *)pVVar9->pArray[lVar10];
      Abc_ObjName(pAVar6);
      pcVar8 = Abc_ObjName(pAVar6);
      pAVar7 = Abc_NtkFindCi(pNtk1,pcVar8);
      (pAVar6->field_6).pCopy = pAVar7;
      if (pAVar7 == (Abc_Obj_t *)0x0) {
        pAVar7 = Abc_NtkDupObj(pNtk1,pAVar6,1);
        (pAVar6->field_6).pCopy = pAVar7;
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      lVar10 = lVar10 + 1;
      pVVar9 = pNtk2->vCis;
    } while (lVar10 < pVVar9->nSize);
    if ((int)uVar11 != 0) {
      printf("Warning: Procedure Abc_NtkAppend() added %d new CIs.\n",uVar11);
    }
  }
  if (pNtk2->ntkType == ABC_NTK_LOGIC) {
    Abc_NtkStrashPerform(pNtk2,pNtk1,1,0);
  }
  else {
    pVVar9 = pNtk2->vObjs;
    if (0 < pVVar9->nSize) {
      lVar10 = 0;
      do {
        plVar1 = (long *)pVVar9->pArray[lVar10];
        if ((plVar1 != (long *)0x0) && (uVar5 = *(uint *)((long)plVar1 + 0x14), (uVar5 & 0xf) == 7))
        {
          lVar2 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
          pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk1->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)(uVar5 >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar2 + (long)*(int *)plVar1[4] * 8) + 0x40)),
                              (Abc_Obj_t *)
                              ((ulong)(uVar5 >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar2 + (long)((int *)plVar1[4])[1] * 8) + 0x40))
                             );
          plVar1[8] = (long)pAVar6;
          pVVar9 = pNtk2->vObjs;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar9->nSize);
    }
  }
  if (fAddPos == 0) {
    pVVar9 = pNtk2->vCos;
    if (0 < pVVar9->nSize) {
      lVar10 = 0;
      do {
        pAVar6 = (Abc_Obj_t *)pVVar9->pArray[lVar10];
        p = pNtk1->pManName;
        pcVar8 = Abc_ObjName(pAVar6);
        uVar5 = Nm_ManFindIdByNameTwoTypes(p,pcVar8,3,4);
        if ((int)uVar5 < 0) {
          __assert_fail("iNodeId >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                        ,0x17c,"int Abc_NtkAppend(Abc_Ntk_t *, Abc_Ntk_t *, int)");
        }
        if (pNtk1->vObjs->nSize <= (int)uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar7 = (Abc_Obj_t *)pNtk1->vObjs->pArray[uVar5];
        pvVar3 = pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
        pAVar6 = Abc_AigOr((Abc_Aig_t *)pNtk1->pManFunc,
                           (Abc_Obj_t *)
                           ((ulong)(*(uint *)&pAVar7->field_0x14 >> 10 & 1) ^ (ulong)pvVar3),
                           (Abc_Obj_t *)
                           ((ulong)(*(uint *)&pAVar6->field_0x14 >> 10 & 1) ^
                           *(ulong *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] +
                                     0x40)));
        pFaninOld = (Abc_Obj_t *)((ulong)pvVar3 & 0xfffffffffffffffe);
        pAVar6 = (Abc_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe);
        if (pFaninOld != pAVar6) {
          Abc_ObjPatchFanin(pAVar7,pFaninOld,
                            (Abc_Obj_t *)
                            ((ulong)((*(uint *)&pAVar6->field_0x14 ^ *(uint *)&pFaninOld->field_0x14
                                     ) >> 7 & 1) | (ulong)pAVar6));
        }
        lVar10 = lVar10 + 1;
        pVVar9 = pNtk2->vCos;
      } while (lVar10 < pVVar9->nSize);
    }
  }
  else {
    pVVar9 = pNtk2->vPos;
    if (0 < pVVar9->nSize) {
      lVar10 = 0;
      do {
        pAVar6 = (Abc_Obj_t *)pVVar9->pArray[lVar10];
        Abc_NtkDupObj(pNtk1,pAVar6,0);
        Abc_ObjAddFanin((pAVar6->field_6).pCopy,
                        (Abc_Obj_t *)
                        ((ulong)(*(uint *)&pAVar6->field_0x14 >> 10 & 1) ^
                        *(ulong *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] +
                                  0x40)));
        pAVar7 = (pAVar6->field_6).pCopy;
        pcVar8 = Abc_ObjName(pAVar6);
        Abc_ObjAssignName(pAVar7,pcVar8,(char *)0x0);
        lVar10 = lVar10 + 1;
        pVVar9 = pNtk2->vPos;
      } while (lVar10 < pVVar9->nSize);
    }
  }
  iVar4 = Abc_NtkCheck(pNtk1);
  if (iVar4 != 0) {
    return 1;
  }
  pcVar8 = "Abc_NtkAppend: The network check has failed.";
LAB_003092fd:
  puts(pcVar8);
  return 0;
}

Assistant:

int Abc_NtkAppend( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fAddPos )
{
    Abc_Obj_t * pObj;
    char * pName;
    int i, nNewCis;
    // the first network should be an AIG
    assert( Abc_NtkIsStrash(pNtk1) );
    assert( Abc_NtkIsLogic(pNtk2) || Abc_NtkIsStrash(pNtk2) ); 
    if ( Abc_NtkIsLogic(pNtk2) && !Abc_NtkToAig(pNtk2) )
    {
        printf( "Converting to AIGs has failed.\n" );
        return 0;
    }
    // check that the networks have the same PIs
    // reorder PIs of pNtk2 according to pNtk1
    if ( !Abc_NtkCompareSignals( pNtk1, pNtk2, 1, 1 ) )
        printf( "Abc_NtkAppend(): The union of the network PIs is computed (warning).\n" );
    // perform strashing
    nNewCis = 0;
    Abc_NtkCleanCopy( pNtk2 );
    if ( Abc_NtkIsStrash(pNtk2) )
        Abc_AigConst1(pNtk2)->pCopy = Abc_AigConst1(pNtk1);
    Abc_NtkForEachCi( pNtk2, pObj, i )
    {
        pName = Abc_ObjName(pObj);
        pObj->pCopy = Abc_NtkFindCi(pNtk1, Abc_ObjName(pObj));
        if ( pObj->pCopy == NULL )
        {
            pObj->pCopy = Abc_NtkDupObj(pNtk1, pObj, 1);
            nNewCis++;
        }
    }
    if ( nNewCis )
        printf( "Warning: Procedure Abc_NtkAppend() added %d new CIs.\n", nNewCis );
    // add pNtk2 to pNtk1 while strashing
    if ( Abc_NtkIsLogic(pNtk2) )
        Abc_NtkStrashPerform( pNtk2, pNtk1, 1, 0 );
    else
        Abc_NtkForEachNode( pNtk2, pObj, i )
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtk1->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // add the COs of the second network
    if ( fAddPos )
    {
        Abc_NtkForEachPo( pNtk2, pObj, i )
        {
            Abc_NtkDupObj( pNtk1, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
        }
    }
    else
    {
        Abc_Obj_t * pObjOld, * pDriverOld, * pDriverNew;
        int fCompl, iNodeId;
        // OR the choices
        Abc_NtkForEachCo( pNtk2, pObj, i )
        {
            iNodeId = Nm_ManFindIdByNameTwoTypes( pNtk1->pManName, Abc_ObjName(pObj), ABC_OBJ_PO, ABC_OBJ_BI );
//            if ( iNodeId < 0 )
//                continue;
            assert( iNodeId >= 0 );
            pObjOld = Abc_NtkObj( pNtk1, iNodeId );
            // derive the new driver
            pDriverOld = Abc_ObjChild0( pObjOld );
            pDriverNew = Abc_ObjChild0Copy( pObj );
            pDriverNew = Abc_AigOr( (Abc_Aig_t *)pNtk1->pManFunc, pDriverOld, pDriverNew );
            if ( Abc_ObjRegular(pDriverOld) == Abc_ObjRegular(pDriverNew) )
                continue;
            // replace the old driver by the new driver
            fCompl = Abc_ObjRegular(pDriverOld)->fPhase ^ Abc_ObjRegular(pDriverNew)->fPhase;
            Abc_ObjPatchFanin( pObjOld, Abc_ObjRegular(pDriverOld), Abc_ObjNotCond(Abc_ObjRegular(pDriverNew), fCompl) );
        }
    }
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk1 ) )
    {
        printf( "Abc_NtkAppend: The network check has failed.\n" );
        return 0;
    }
    return 1;
}